

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O1

bool __thiscall
wallet::RunWithinTxn
          (wallet *this,WalletBatch *batch,string_view process_desc,
          function<bool_(wallet::WalletBatch_&)> *func)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  Logger *pLVar4;
  int source_line;
  char *pcVar5;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  char *in_stack_ffffffffffffffd0;
  
  pcVar5 = process_desc._M_str;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar2 = (**(code **)(**(long **)this + 0x58))();
  if (cVar2 == '\0') {
    pLVar4 = LogInstance();
    bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar4,WALLETDB,Debug);
    if (bVar3) {
      pcVar5 = "Error: cannot create db txn for %s\n";
      source_line = 0x4e2;
LAB_001b156b:
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp"
      ;
      source_file._M_len = 0x5c;
      logging_function._M_str = "RunWithinTxn";
      logging_function._M_len = 0xc;
      LogPrintf_<std::basic_string_view<char,std::char_traits<char>>>
                (logging_function,source_file,source_line,(LogFlags)pcVar5,
                 (Level)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd0,
                 (basic_string_view<char,_std::char_traits<char>_> *)batch);
    }
    goto LAB_001b15c9;
  }
  if (*(long *)(pcVar5 + 0x10) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      std::__throw_bad_function_call();
    }
    goto LAB_001b15f8;
  }
  cVar2 = (**(code **)(pcVar5 + 0x18))(pcVar5,this);
  if (cVar2 == '\0') {
    pLVar4 = LogInstance();
    bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar4,WALLETDB,Debug);
    if (bVar3) {
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp"
      ;
      source_file_00._M_len = 0x5c;
      logging_function_00._M_str = "RunWithinTxn";
      logging_function_00._M_len = 0xc;
      LogPrintf_<std::basic_string_view<char,std::char_traits<char>>>
                (logging_function_00,source_file_00,0x4e8,
                 I2P|QT|LIBEVENT|MEMPOOLREJ|RAND|ADDRMAN|ESTIMATEFEE|HTTP|MEMPOOL|NET,
                 (Level)&stack0xffffffffffffffd8,in_stack_ffffffffffffffd0,
                 (basic_string_view<char,_std::char_traits<char>_> *)batch);
    }
    (**(code **)(**(long **)this + 0x68))();
LAB_001b15c9:
    bVar3 = false;
  }
  else {
    cVar2 = (**(code **)(**(long **)this + 0x60))();
    bVar3 = true;
    if (cVar2 == '\0') {
      pLVar4 = LogInstance();
      bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar4,WALLETDB,Debug);
      if (bVar3) {
        pcVar5 = "Error: cannot commit db txn for %s\n";
        source_line = 0x4ee;
        goto LAB_001b156b;
      }
      goto LAB_001b15c9;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
LAB_001b15f8:
  __stack_chk_fail();
}

Assistant:

static bool RunWithinTxn(WalletBatch& batch, std::string_view process_desc, const std::function<bool(WalletBatch&)>& func)
{
    if (!batch.TxnBegin()) {
        LogDebug(BCLog::WALLETDB, "Error: cannot create db txn for %s\n", process_desc);
        return false;
    }

    // Run procedure
    if (!func(batch)) {
        LogDebug(BCLog::WALLETDB, "Error: %s failed\n", process_desc);
        batch.TxnAbort();
        return false;
    }

    if (!batch.TxnCommit()) {
        LogDebug(BCLog::WALLETDB, "Error: cannot commit db txn for %s\n", process_desc);
        return false;
    }

    // All good
    return true;
}